

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-prepared.c
# Opt level: O0

char * borg_prepared(wchar_t depth)

{
  monster_race *pmVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  monster_race *r_ptr_1;
  monster_race *r_ptr;
  char *pcStack_20;
  wchar_t heals;
  char *reason;
  char *pcStack_10;
  wchar_t depth_local;
  
  if (depth == L'\x01') {
    return (char *)0x0;
  }
  if (borg_cfg[0xd] == 0) {
    pcVar4 = borg_restock(depth);
    if (pcVar4 != (char *)0x0) {
      return pcVar4;
    }
    if ((borg.trait[0x24] < depth) && (borg.trait[0x24] < 0x32)) {
      pcStack_10 = "Clevel < depth";
      return pcStack_10;
    }
    pcStack_20 = (char *)0x0;
    if ((depth < L'd') && (pcStack_20 = borg_prepared_aux(depth), pcStack_20 != (char *)0x0)) {
      return pcStack_20;
    }
    if (borg_cfg[0x10] <= depth) {
      strnfmt(borg_prepared_buffer,0x400,"No deeper %d.",(ulong)(uint)borg_cfg[0x10]);
      pcStack_10 = borg_prepared_buffer;
      return pcStack_10;
    }
  }
  else {
    pcVar4 = borg_restock(depth);
    if (pcVar4 != (char *)0x0) {
      return pcVar4;
    }
    pcStack_20 = borg_prepared_dynamic(depth);
    if (pcStack_20 != (char *)0x0) {
      return pcStack_20;
    }
  }
  if (borg.trait[0x6b] == 0) {
    if (borg.trait[0x69] == 0) {
      pcStack_10 = pcStack_20;
    }
    else if (((depth < L'R') || (9 < (int)num_ezheal + (int)num_life)) ||
            (9 < borg.trait[0xd7] + borg.trait[0xd8])) {
      if ((L'Q' < depth) && (0x60 < borg.trait[0x6a])) {
        borg_notice_home((borg_item_conflict *)0x0,false);
        iVar3 = (int)num_ezheal_true + borg.trait[0xd7] + (int)num_life_true + borg.trait[0xd8];
        if (iVar3 < 0x1e) {
          strnfmt(borg_prepared_buffer,0x400,"Scumming *Heal* potions (%d to go).",
                  (ulong)(0x1e - iVar3));
          pcStack_10 = borg_prepared_buffer;
          return pcStack_10;
        }
        if (((borg.trait[0xd7] + borg.trait[0xd8] < 0x1e) && (0x1d < iVar3)) &&
           ((0 < num_ezheal_true && (0x62 < borg.trait[0x6a])))) {
          strnfmt(borg_prepared_buffer,0x400,"Collect from house (%d potions).",
                  (ulong)(uint)((int)num_ezheal_true + (int)num_life_true));
          pcStack_10 = borg_prepared_buffer;
          return pcStack_10;
        }
      }
      pmVar1 = r_info;
      if (borg.trait[0x6a] < 99) {
        if (borg_cfg[0xb] == 0) {
          pcStack_10 = (char *)0x0;
        }
        else if (borg_numb_live_unique < L'\x03') {
          pcStack_10 = (char *)0x0;
        }
        else if (borg_depth_hunted_unique < depth) {
          strnfmt(borg_prepared_buffer,0x400,"Must kill %s.",r_info[borg_first_living_unique].name);
          pcStack_10 = borg_prepared_buffer;
        }
        else {
          pcStack_10 = (char *)0x0;
        }
      }
      else if ((borg.trait[0x6a] < 0x62) || (depth < L'b')) {
        pcStack_10 = (char *)0x0;
      }
      else {
        uVar5 = (ulong)borg_first_living_unique;
        borg.ready_morgoth = L'\xffffffff';
        if ((borg_numb_live_unique < L'\x01') || (borg_first_living_unique == borg_morgoth_id)) {
          if (L'b' < depth) {
            borg.ready_morgoth = L'\x01';
          }
          pcStack_10 = (char *)0x0;
        }
        else if (((borg.trait[0x6a] == 99) && (depth < L'c')) &&
                ((_Var2 = borg_spell_legal_fail(TELEPORT_LEVEL,0x14), _Var2 ||
                 (0 < borg.trait[0xf7])))) {
          pcStack_10 = (char *)0x0;
        }
        else {
          strnfmt(borg_prepared_buffer,0x400,"%s still alive!",pmVar1[uVar5].name);
          pcStack_10 = borg_prepared_buffer;
        }
      }
    }
    else {
      borg_notice_home((borg_item_conflict *)0x0,false);
      strnfmt(borg_prepared_buffer,0x400,"Scumming *Heal* potions (%d to go).",
              (ulong)(10 - (int)num_ezheal));
      pcStack_10 = borg_prepared_buffer;
    }
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char *borg_prepared(int depth)
{
    const char *reason;

    /* Town and First level */
    if (depth == 1)
        return ((char *)NULL);

    if (borg_cfg[BORG_USES_DYNAMIC_CALCS]) {

        /* use the base restock so special checks can be done */
        if ((reason = borg_restock(depth)))
            return reason;

        if ((reason = borg_prepared_dynamic(depth)))
            return reason;

    } else {
        /* Not prepared if I need to restock */
        if ((reason = borg_restock(depth)))
            return (reason);

        /*** Require his Clevel to be greater than or equal to Depth */
        if (borg.trait[BI_MAXCLEVEL] < depth && borg.trait[BI_MAXCLEVEL] < 50)
            return ("Clevel < depth");

        /* Must meet minimal requirements */
        if (depth <= 99) {
            if ((reason = borg_prepared_aux(depth)))
                return (reason);
        }

        /* Not if No_Deeper is set */
        if (depth >= borg_cfg[BORG_NO_DEEPER]) {
            strnfmt(borg_prepared_buffer, MAX_REASON, "No deeper %d.",
                borg_cfg[BORG_NO_DEEPER]);
            return (borg_prepared_buffer);
        }
    }

    /* Once Morgoth is dead */
    if (borg.trait[BI_KING]) {
        return ((char *)NULL);
    }

    /* Always okay from town */
    if (!borg.trait[BI_CDEPTH])
        return (reason);

    /* Scum on depth 80-81 for some *heal* potions */
    if (depth >= 82
        && ((num_ezheal + num_life) < 10
            && (borg.trait[BI_AEZHEAL] + borg.trait[BI_ALIFE]) < 10)) {
        /* Must know exact number of Potions  in home */
        borg_notice_home(NULL, false);

        strnfmt(borg_prepared_buffer, MAX_REASON,
            "Scumming *Heal* potions (%d to go).", 10 - num_ezheal);
        return (borg_prepared_buffer);
    }

    /* Scum on depth 80-81 for lots of *Heal* potions preparatory for Endgame */
    if (depth >= 82 && borg.trait[BI_MAXDEPTH] >= 97) {
        /* Must know exact number of Potions  in home */
        borg_notice_home(NULL, false);

        /* Scum for 30*/
        int heals = num_ezheal_true + borg.trait[BI_AEZHEAL] + num_life_true
                    + borg.trait[BI_ALIFE];
        if (heals < 30) {
            strnfmt(borg_prepared_buffer, MAX_REASON,
                "Scumming *Heal* potions (%d to go).",
                30 - heals);
            return (borg_prepared_buffer);
        }

        /* Return to town to get your stock from the home */
        if ((borg.trait[BI_AEZHEAL] + borg.trait[BI_ALIFE]) < 30 && heals >= 30
            && num_ezheal_true >= 1 && borg.trait[BI_MAXDEPTH] >= 99)
        {
            strnfmt(borg_prepared_buffer, MAX_REASON,
                "Collect from house (%d potions).",
                num_ezheal_true + num_life_true);
            return (borg_prepared_buffer);
        }
    }

    /* Check to make sure the borg does not go below where 3 living */
    /* uniques are. */
    if (borg.trait[BI_MAXDEPTH] <= 98) {
        struct monster_race *r_ptr;

        /* don't check how many uniques are alive */
        if (borg_cfg[BORG_KILLS_UNIQUES] == false)
            return ((char *)NULL);

        /* are too many uniques alive */
        if (borg_numb_live_unique < 3)
            return ((char *)NULL);

        /* Check for the dlevel of the unique */
        if (depth <= borg_depth_hunted_unique)
            return ((char *)NULL);

        /* To avoid double calls to format() */
        /* Reset our description for not diving */
        r_ptr = &r_info[borg_first_living_unique];
        strnfmt(borg_prepared_buffer, MAX_REASON, "Must kill %s.", r_ptr->name);
        return (borg_prepared_buffer);

    } else if (borg.trait[BI_MAXDEPTH] >= 98 && depth >= 98)
    /* check to make sure the borg does not go to level 100 */
    /* unless all the uniques are dead. */
    {
        struct monster_race *r_ptr;

        /* Access the living unique obtained from borg_update() */
        r_ptr = &r_info[borg_first_living_unique];

        /* -1 is unknown. */
        borg.ready_morgoth = -1;

        /* is only Morgoth alive? */
        if (borg_numb_live_unique < 1
            || borg_first_living_unique == borg_morgoth_id)
        {
            if (depth >= 99)
                borg.ready_morgoth = 1;
            return ((char *)NULL);
        }

        /* Under special cases allow the borg to dive to 99 then quickly
         * get his butt to dlevel 98
         */
        if (borg.trait[BI_MAXDEPTH] == 99 && depth <= 98
            && (borg_spell_legal_fail(TELEPORT_LEVEL, 20)
                || /* Teleport Level */
                borg.trait[BI_ATELEPORTLVL] >= 1)) /* Teleport Level scroll */
        {
            return ((char *)NULL);
        }

        /* To avoid double calls to format() */
        strnfmt(
            borg_prepared_buffer, MAX_REASON, "%s still alive!", r_ptr->name);
        return (borg_prepared_buffer);
    }
    return (char *)NULL;
}